

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

__ssize_t ixxx::posix::getline(char **__lineptr,size_t *__n,FILE *__stream)

{
  int *piVar1;
  __ssize_t _Var2;
  getline_error *this;
  ssize_t r;
  FILE *f_local;
  size_t *n_local;
  char **line_local;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  _Var2 = ::getline(__lineptr,__n,__stream);
  if (_Var2 == -1) {
    piVar1 = __errno_location();
    if (*piVar1 != 0) {
      this = (getline_error *)__cxa_allocate_exception(0x20);
      piVar1 = __errno_location();
      getline_error::sys_error(this,*piVar1,(char *)0x0,ERRNO);
      __cxa_throw(this,&getline_error::typeinfo,getline_error::~getline_error);
    }
  }
  return _Var2;
}

Assistant:

ssize_t getline(char **line, size_t *n, FILE *f)
    {
        errno = 0;
        ssize_t r = ::getline(line, n, f);
        if (r == -1 && errno)
            throw getline_error(errno);
        return r;
    }